

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O2

bool __thiscall AAmmoFillup::TryPickup(AAmmoFillup *this,AActor **toucher)

{
  PClassActor *type;
  AInventory *pAVar1;
  
  type = PClass::FindActor(NAME_ClipOfBullets);
  if (type == (PClassActor *)0x0) {
    return true;
  }
  pAVar1 = AActor::FindInventory(*toucher,type,false);
  if (pAVar1 == (AInventory *)0x0) {
    pAVar1 = AActor::GiveInventoryType(*toucher,type);
    if (pAVar1 == (AInventory *)0x0) goto LAB_005489a5;
  }
  else if (0x31 < pAVar1->Amount) {
    return false;
  }
  pAVar1->Amount = 0x32;
LAB_005489a5:
  (*(this->super_ADummyStrifeItem).super_AInventory.super_AActor.super_DThinker.super_DObject.
    _vptr_DObject[0x36])(this);
  return true;
}

Assistant:

bool AAmmoFillup::TryPickup (AActor *&toucher)
{
	PClassActor *clip = PClass::FindActor(NAME_ClipOfBullets);
	if (clip != NULL)
	{
		AInventory *item = toucher->FindInventory(clip);
		if (item == NULL)
		{
			item = toucher->GiveInventoryType (clip);
			if (item != NULL)
			{
				item->Amount = 50;
			}
		}
		else if (item->Amount < 50)
		{
			item->Amount = 50;
		}
		else
		{
			return false;
		}
		GoAwayAndDie ();
	}
	return true;
}